

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  pointer pcVar5;
  pointer pSVar6;
  undefined1 auStack_128 [8];
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  columns;
  undefined1 *local_108;
  undefined1 local_100 [48];
  SummaryColumn local_d0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  undefined1 local_80 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  sVar2 = (totals->testCases).failed;
  sVar3 = (totals->testCases).failedButOk;
  if ((totals->testCases).passed + sVar2 + sVar3 == 0) {
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_90 = (undefined1  [8])((ulong)(uint7)local_90._1_7_ << 8);
    Colour::use(ReconstructedExpression);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"No tests ran\n",0xd);
    Colour::use(None);
  }
  else if ((sVar3 == 0 && sVar2 == 0) &&
          ((totals->assertions).failed + (totals->assertions).passed !=
           -(totals->assertions).failedButOk)) {
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_90 = (undefined1  [8])((ulong)(uint7)local_90._1_7_ << 8);
    Colour::use(BrightGreen);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"All tests passed",0x10);
    Colour::use(None);
    poVar4 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
    pcVar5 = (pointer)(totals->assertions).passed;
    paVar1 = &local_d0.label.field_2;
    local_d0.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"assertion","");
    local_90 = (undefined1  [8])pcVar5;
    local_88._M_p = local_80 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_d0.label._M_dataplus._M_p,
               local_d0.label._M_dataplus._M_p +
               (long)(_Alloc_hider *)local_d0.label._M_string_length);
    operator<<(poVar4,(pluralise *)local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
    pSVar6 = (pointer)(totals->testCases).passed;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"test case","");
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar6;
    local_108 = local_100 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,local_50,local_48 + (long)local_50);
    operator<<(poVar4,(pluralise *)
                      &columns.
                       super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_108 != local_100 + 8) {
      operator_delete(local_108,local_100._8_8_ + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (local_88._M_p != local_80 + 8) {
      operator_delete(local_88._M_p,local_80._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.label._M_dataplus._M_p,
                      local_d0.label.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    auStack_128 = (undefined1  [8])0x0;
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    columns.
    super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    paVar1 = &local_d0.label.field_2;
    local_d0.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_50,local_48 + (long)local_50);
    local_d0.colour = None;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SummaryColumn::addRow
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0,
               (totals->testCases).failed + (totals->testCases).passed +
               (totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)local_90,
               (SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (totals->assertions).failed + (totals->assertions).passed +
               (totals->assertions).failedButOk);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>
              ((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)auStack_128,(SummaryColumn *)local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if (local_90 != (undefined1  [8])local_80) {
      operator_delete((void *)local_90,local_80._0_8_ + 1);
    }
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + 0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    if (columns.
        super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_100) {
      operator_delete(columns.
                      super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)(local_100._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0.rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.label._M_dataplus._M_p,
                      local_d0.label.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"passed","");
    local_d0.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_50,local_48 + (long)local_50);
    local_d0.colour = Green;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SummaryColumn::addRow
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0,
               (totals->testCases).passed);
    SummaryColumn::addRow
              ((SummaryColumn *)local_90,
               (SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(totals->assertions).passed);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>
              ((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)auStack_128,(SummaryColumn *)local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if (local_90 != (undefined1  [8])local_80) {
      operator_delete((void *)local_90,local_80._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    if (columns.
        super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_100) {
      operator_delete(columns.
                      super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)(local_100._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0.rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.label._M_dataplus._M_p,
                      local_d0.label.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"failed","");
    local_d0.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_50,local_48 + (long)local_50);
    local_d0.colour = BrightRed;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SummaryColumn::addRow
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0,
               (totals->testCases).failed);
    SummaryColumn::addRow
              ((SummaryColumn *)local_90,
               (SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(totals->assertions).failed);
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>
              ((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)auStack_128,(SummaryColumn *)local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if (local_90 != (undefined1  [8])local_80) {
      operator_delete((void *)local_90,local_80._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    if (columns.
        super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_100) {
      operator_delete(columns.
                      super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)(local_100._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0.rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.label._M_dataplus._M_p,
                      local_d0.label.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"failed as expected","");
    local_d0.label._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_50,local_48 + (long)local_50);
    local_d0.colour = ReconstructedExpression;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.rows.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SummaryColumn::addRow
              ((SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0,
               (totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)local_90,
               (SummaryColumn *)
               &columns.
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(totals->assertions).failedButOk)
    ;
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::emplace_back<Catch::ConsoleReporter::SummaryColumn>
              ((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                *)auStack_128,(SummaryColumn *)local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if (local_90 != (undefined1  [8])local_80) {
      operator_delete((void *)local_90,local_80._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + 0x18));
    if (columns.
        super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_100) {
      operator_delete(columns.
                      super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)(local_100._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0.rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.label._M_dataplus._M_p,
                      local_d0.label.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_90 = (undefined1  [8])local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"test cases","");
    printSummaryRow(this,(string *)local_90,
                    (vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                     *)auStack_128,0);
    if (local_90 != (undefined1  [8])local_80) {
      operator_delete((void *)local_90,local_80._0_8_ + 1);
    }
    local_90 = (undefined1  [8])local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"assertions","");
    printSummaryRow(this,(string *)local_90,
                    (vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                     *)auStack_128,1);
    if (local_90 != (undefined1  [8])local_80) {
      operator_delete((void *)local_90,local_80._0_8_ + 1);
    }
    std::
    vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
    ::~vector((vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
               *)auStack_128);
  }
  return;
}

Assistant:

void printTotals( Totals const& totals ) {
            if( totals.testCases.total() == 0 ) {
                stream << Colour( Colour::Warning ) << "No tests ran\n";
            }
            else if( totals.assertions.total() > 0 && totals.testCases.allPassed() ) {
                stream << Colour( Colour::ResultSuccess ) << "All tests passed";
                stream << " ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")"
                        << "\n";
            }
            else {

                std::vector<SummaryColumn> columns;
                columns.push_back( SummaryColumn( "", Colour::None )
                                        .addRow( totals.testCases.total() )
                                        .addRow( totals.assertions.total() ) );
                columns.push_back( SummaryColumn( "passed", Colour::Success )
                                        .addRow( totals.testCases.passed )
                                        .addRow( totals.assertions.passed ) );
                columns.push_back( SummaryColumn( "failed", Colour::ResultError )
                                        .addRow( totals.testCases.failed )
                                        .addRow( totals.assertions.failed ) );
                columns.push_back( SummaryColumn( "failed as expected", Colour::ResultExpectedFailure )
                                        .addRow( totals.testCases.failedButOk )
                                        .addRow( totals.assertions.failedButOk ) );

                printSummaryRow( "test cases", columns, 0 );
                printSummaryRow( "assertions", columns, 1 );
            }
        }